

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::remove_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  undefined1 *puVar1;
  CVmHashEntry *__filename;
  vm_obj_id_t obj_local;
  
  obj_local = obj;
  __filename = CVmHashTable::find(this->post_load_init_table_,(char *)&obj_local,4);
  if (__filename != (CVmHashEntry *)0x0) {
    CVmHashTable::remove(this->post_load_init_table_,(char *)__filename);
    (*__filename->_vptr_CVmHashEntry[1])(__filename);
    puVar1 = &this->pages_[obj_local >> 0xc][obj_local & 0xfff].field_0x14;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfeff;
  }
  return;
}

Assistant:

void CVmObjTable::remove_post_load_init(vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* find the entry */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));

    /* if we found the entry, remove it from the table and delete it */
    if (entry != 0)
    {
        /* remove it */
        post_load_init_table_->remove(entry);

        /* delete it */
        delete entry;

        /* mark the entry as no longer being registered for post-load init */
        get_entry(obj)->requested_post_load_init_ = FALSE;
    }
}